

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O3

void __thiscall
Enterprise::ConcreteMachine<false,_false>::ConcreteMachine
          (ConcreteMachine<false,_false> *this,Target *target,ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  int iVar1;
  int iVar2;
  pointer pNVar3;
  Target *pTVar4;
  bool bVar5;
  long lVar6;
  pointer pNVar7;
  pointer pNVar8;
  pointer pNVar9;
  pointer pNVar10;
  undefined4 *puVar11;
  byte bVar12;
  pointer pNVar13;
  size_t sVar14;
  void *__src;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *pvVar15;
  array<unsigned_char,_16384UL> *__s;
  pointer pNVar16;
  array<unsigned_char,_65536UL> *__s_00;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  undefined1 local_248 [8];
  bool local_240;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_238;
  Target *local_220;
  Node local_218;
  undefined1 local_1e8 [8];
  undefined1 auStack_1e0 [8];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_1d8;
  pointer local_1c0;
  undefined1 local_1b8 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_1a8;
  Request local_188;
  array<unsigned_char,_65536UL> *local_160;
  Processor<Enterprise::ConcreteMachine<false,_false>,_false,_false> *local_158;
  LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true> *local_150;
  undefined1 local_148 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_138;
  Request local_120;
  EXDos *local_f8;
  AsyncTaskQueue<false,_true,_void> *local_f0;
  undefined1 local_e8 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_d8;
  Request local_c0;
  undefined1 local_98 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_88;
  Request local_70;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_48;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR___cxa_pure_virtual_00590d50;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR___cxa_pure_virtual_00598df8;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_00598e18;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_00590d68;
  local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8 = (undefined1  [8])0x0;
  auStack_1e0._0_4_ = Any;
  auStack_1e0._4_4_ = None;
  local_1c0 = (pointer)0x0;
  local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_1e0;
  local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)auStack_1e0;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)local_1e8);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)local_1e8);
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).previous_typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).character_mapper.super_CharacterMapper.
  _vptr_CharacterMapper = (_func_int **)&PTR__CharacterMapper_00599a90;
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_00598ad8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00598b78;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00598b98;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00598bb8;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00598bd0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00598c00;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00598c40;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00598c58;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00598c90;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).super_Delegate.super_KeyActions.
  _vptr_KeyActions = (_func_int **)&PTR_set_key_state_00598cd8;
  memset(&this->ram_,0,0x40000);
  bVar12 = 0xfc;
  if (target->model != Enterprise64) {
    bVar12 = (target->model != Enterprise256) << 3 | 0xf0;
  }
  this->min_ram_slot_ = bVar12;
  this->write_pointers_[2] = (uint8_t *)0x0;
  this->write_pointers_[3] = (uint8_t *)0x0;
  this->write_pointers_[0] = (uint8_t *)0x0;
  this->write_pointers_[1] = (uint8_t *)0x0;
  this->read_pointers_[2] = (uint8_t *)0x0;
  this->read_pointers_[3] = (uint8_t *)0x0;
  this->read_pointers_[0] = (uint8_t *)0x0;
  this->read_pointers_[1] = (uint8_t *)0x0;
  this->pages_[0] = 0x80;
  this->pages_[1] = 0x80;
  this->pages_[2] = 0x80;
  this->pages_[3] = 0x80;
  this->wait_mode_ = OnAllAccesses;
  this->is_video_[0] = false;
  this->is_video_[1] = false;
  this->is_video_[2] = false;
  this->is_video_[3] = false;
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_00599a60;
  this->active_key_line_ = '\0';
  this->should_skip_splash_screen_ = false;
  this->typer_delay_ = 0x1e;
  this->interrupt_mask_ = '\0';
  this->interrupt_state_ = '\0';
  local_158 = &this->z80_;
  CPU::Z80::Processor<Enterprise::ConcreteMachine<false,_false>,_false,_false>::Processor
            (local_158,this);
  (this->nick_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_00598eb0;
  Nick::Nick(&(this->nick_).object_,(this->ram_)._M_elems + 0x30000);
  (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->nick_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->nick_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->nick_).is_flushed_ = true;
  (this->nick_).did_flush_ = false;
  (this->nick_).clocking_preference_ = JustInTime;
  (this->nick_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
  this->previous_nick_interrupt_line_ = false;
  this_00 = &this->audio_queue_;
  local_220 = target;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  local_f0 = this_00;
  Dave::Audio::Audio(&this->dave_audio_,this_00);
  local_150 = &(this->speaker_).
               super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>;
  Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>::PullLowpass
            ((PullLowpass<Enterprise::Dave::Audio> *)local_150,&this->dave_audio_);
  (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->dave_delay_).super_WrappedInt<HalfCycles>.length_ = 2;
  JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::JustInTimeActor<>
            (&this->dave_timer_);
  local_f8 = &this->exdos_;
  EXDos::EXDos(local_f8);
  (this->super_TimedMachine).clock_rate_ = 4000000.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>::
  set_input_rate(local_150,500000.0);
  local_248 = (undefined1  [8])0x2;
  local_240 = false;
  local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(local_220->exos_version) {
  case v10:
    ROM::Request::Request((Request *)&local_218,EnterpriseEXOS10,false);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    break;
  case v20:
    ROM::Request::Request((Request *)&local_218,EnterpriseEXOS20,false);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    break;
  case v21:
    ROM::Request::Request((Request *)&local_218,EnterpriseEXOS21,false);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    break;
  case v23:
    ROM::Request::Request((Request *)&local_218,EnterpriseEXOS23,false);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    break;
  case Any:
    ROM::Request::Request((Request *)local_148,EnterpriseEXOS10,false);
    ROM::Request::Request(&local_120,EnterpriseEXOS20,false);
    ROM::Request::operator||(&local_188,(Request *)local_148,&local_120);
    ROM::Request::Request((Request *)local_e8,EnterpriseEXOS21,false);
    ROM::Request::operator||((Request *)local_1b8,&local_188,(Request *)local_e8);
    ROM::Request::Request(&local_c0,EnterpriseEXOS23,false);
    ROM::Request::operator||((Request *)&local_218,(Request *)local_1b8,&local_c0);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    local_88.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98._8_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_98._0_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240 = auStack_1e0[0];
    local_248 = local_1e8;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_98);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1d8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_218.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_c0.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1a8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_d8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_188.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_120.node.children);
    pvVar15 = &local_138;
    goto LAB_0032d2c4;
  default:
    goto switchD_0032d056_default;
  }
  local_1a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_1b8._8_8_ =
       local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_1b8._0_8_ =
       local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_240 = auStack_1e0[0];
  local_248 = local_1e8;
  local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_1b8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1d8);
  pvVar15 = &local_218.children;
LAB_0032d2c4:
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(pvVar15);
switchD_0032d056_default:
  switch(local_220->basic_version) {
  case v10:
    ROM::Request::Request((Request *)local_1b8,EnterpriseBASIC10,false);
    ROM::Request::Request((Request *)local_148,EnterpriseBASIC10Part1,false);
    ROM::Request::Request(&local_120,EnterpriseBASIC10Part2,false);
    ROM::Request::operator&&(&local_188,(Request *)local_148,&local_120);
    ROM::Request::operator||((Request *)&local_218,(Request *)local_1b8,&local_188);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8._8_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_e8._0_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240 = auStack_1e0[0];
    local_248 = local_1e8;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_e8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1d8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_218.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_188.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_120.node.children);
    pvVar15 = &local_138;
    goto LAB_0032d718;
  case v11:
    ROM::Request::Request((Request *)local_1b8,EnterpriseBASIC11,false);
    ROM::Request::Request(&local_188,EnterpriseBASIC11Suffixed,false);
    ROM::Request::operator||((Request *)&local_218,(Request *)local_1b8,&local_188);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    local_138.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148._8_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_148._0_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240 = auStack_1e0[0];
    local_248 = local_1e8;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_148);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1d8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_218.children);
    pvVar15 = &local_188.node.children;
LAB_0032d718:
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(pvVar15);
    pvVar15 = &local_1a8;
    break;
  case v21:
    ROM::Request::Request((Request *)&local_218,EnterpriseBASIC21,false);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    local_1a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._8_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1b8._0_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240 = auStack_1e0[0];
    local_248 = local_1e8;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_1b8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1d8);
    pvVar15 = &local_218.children;
    break;
  case Any:
    ROM::Request::Request((Request *)local_148,EnterpriseBASIC10,false);
    ROM::Request::Request((Request *)local_e8,EnterpriseBASIC10Part1,false);
    ROM::Request::Request(&local_c0,EnterpriseBASIC10Part2,false);
    ROM::Request::operator&&(&local_120,(Request *)local_e8,&local_c0);
    ROM::Request::operator||(&local_188,(Request *)local_148,&local_120);
    ROM::Request::Request((Request *)local_98,EnterpriseBASIC11,false);
    ROM::Request::operator||((Request *)local_1b8,&local_188,(Request *)local_98);
    ROM::Request::Request(&local_70,EnterpriseBASIC21,false);
    ROM::Request::operator||((Request *)&local_218,(Request *)local_1b8,&local_70);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240 = auStack_1e0[0];
    local_248 = local_1e8;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_48);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1d8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_218.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_70.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1a8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_88);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_188.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_120.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_c0.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_d8);
    pvVar15 = &local_138;
    break;
  default:
    goto switchD_0032d2ec_default;
  }
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(pvVar15);
switchD_0032d2ec_default:
  if (local_220->dos == EXDOS) {
    ROM::Request::Request((Request *)&local_218,EnterpriseEXDOS,false);
    ROM::Request::operator&&((Request *)local_1e8,(Request *)local_248,(Request *)&local_218);
    local_1a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._8_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1b8._0_8_ =
         local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240 = auStack_1e0[0];
    local_248 = local_1e8;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_238.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_1b8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1d8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_218.children);
  }
  if ((rom_fetcher->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*rom_fetcher->_M_invoker)
            ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_1e8,(_Any_data *)rom_fetcher,(Request *)local_248);
  bVar5 = ROM::Request::validate((Request *)local_248,(Map *)local_1e8);
  if (!bVar5) {
    puVar11 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar11 = 0;
    __cxa_throw(puVar11,&ROMMachine::Error::typeinfo,0);
  }
  __s_00 = &this->exos_;
  memset(__s_00,0xff,0x10000);
  pNVar3 = local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_218.type = 0x2f;
  local_218.name = EnterpriseEXOS20;
  local_218.is_optional = true;
  local_218._9_7_ = 0x32000000;
  lVar6 = 0;
  do {
    if (local_1d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      iVar1 = *(int *)((long)&local_218.type + lVar6);
      pNVar9 = (pointer)auStack_1e0;
      pNVar10 = local_1d8.
                super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pNVar13 = pNVar10;
        pNVar8 = pNVar9;
        iVar2 = *(int *)&(pNVar13->children).
                         super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pNVar9 = pNVar13;
        if (iVar2 < iVar1) {
          pNVar9 = pNVar8;
        }
        pNVar10 = (&(pNVar13->children).
                    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                    _M_impl.super__Vector_impl_data._M_start)[iVar2 < iVar1];
      } while (pNVar10 != (pointer)0x0);
      if (pNVar9 != (pointer)auStack_1e0) {
        if (iVar2 < iVar1) {
          pNVar13 = pNVar8;
        }
        if (*(int *)&(pNVar13->children).
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage <= iVar1) {
          sVar14 = *(long *)&pNVar9[1].is_optional - (long)*(void **)(pNVar9 + 1);
          if (0xffff < sVar14) {
            sVar14 = 0x10000;
          }
          memcpy(__s_00,*(void **)(pNVar9 + 1),sVar14);
          break;
        }
      }
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  __s = &this->basic_;
  memset(__s,0xff,0x4000);
  local_218.type = 0x33;
  local_218.name = EnterpriseBASIC11;
  local_218.is_optional = true;
  local_218._9_7_ = 0x38000000;
  lVar6 = 0;
LAB_0032d8bd:
  do {
    if (pNVar3 == (pointer)0x0) goto LAB_0032d912;
    iVar1 = *(int *)((long)&local_218.type + lVar6);
    pNVar9 = (pointer)auStack_1e0;
    pNVar10 = pNVar3;
    do {
      pNVar13 = pNVar10;
      pNVar8 = pNVar9;
      iVar2 = *(int *)&(pNVar13->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar9 = pNVar13;
      if (iVar2 < iVar1) {
        pNVar9 = pNVar8;
      }
      pNVar10 = (&(pNVar13->children).
                  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start)[iVar2 < iVar1];
    } while (pNVar10 != (pointer)0x0);
    if (pNVar9 != (pointer)auStack_1e0) {
      if (iVar2 < iVar1) {
        pNVar13 = pNVar8;
      }
      if (*(int *)&(pNVar13->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage <= iVar1) {
        local_160 = __s_00;
        __src = *(void **)(pNVar9 + 1);
        sVar14 = *(long *)&pNVar9[1].is_optional - (long)__src;
        if (0x3fff < sVar14) {
          sVar14 = 0x4000;
        }
        goto LAB_0032da42;
      }
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  if (pNVar3 != (pointer)0x0) {
    local_160 = __s_00;
    pNVar10 = pNVar3;
    pNVar9 = (pointer)auStack_1e0;
    do {
      pNVar8 = pNVar9;
      pNVar13 = pNVar10;
      iVar1 = *(int *)&(pNVar13->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar9 = pNVar13;
      if (iVar1 < 0x34) {
        pNVar9 = pNVar8;
      }
      pNVar10 = (&(pNVar13->children).
                  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start)[iVar1 < 0x34];
    } while (pNVar10 != (pointer)0x0);
    pNVar10 = pNVar3;
    pNVar16 = (pointer)auStack_1e0;
    pNVar7 = (pointer)auStack_1e0;
    if (pNVar9 != (pointer)auStack_1e0) {
      if (iVar1 < 0x34) {
        pNVar13 = pNVar8;
      }
      pNVar7 = pNVar9;
      if (0x34 < *(int *)&(pNVar13->children).
                          super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pNVar7 = (pointer)auStack_1e0;
      }
    }
    do {
      pNVar13 = pNVar16;
      pNVar9 = pNVar10;
      iVar1 = *(int *)&(pNVar9->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar16 = pNVar9;
      if (iVar1 < 0x35) {
        pNVar16 = pNVar13;
      }
      pNVar10 = (&(pNVar9->children).
                  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start)[iVar1 < 0x35];
    } while (pNVar10 != (pointer)0x0);
    if (pNVar16 != (pointer)auStack_1e0) {
      if (iVar1 < 0x35) {
        pNVar9 = pNVar13;
      }
      if ((pNVar7 != (pointer)auStack_1e0) &&
         (*(int *)&(pNVar9->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage < 0x36)) {
        sVar14 = *(long *)&pNVar7[1].is_optional - (long)*(void **)(pNVar7 + 1);
        if (0x1fff < sVar14) {
          sVar14 = 0x2000;
        }
        memcpy(__s,*(void **)(pNVar7 + 1),sVar14);
        __s = (array<unsigned_char,_16384UL> *)((this->basic_)._M_elems + 0x2000);
        __src = *(void **)(pNVar16 + 1);
        sVar14 = *(long *)&pNVar16[1].is_optional - (long)__src;
        if (0x1fff < sVar14) {
          sVar14 = 0x2000;
        }
LAB_0032da42:
        memcpy(__s,__src,sVar14);
      }
    }
    memset(&this->epdos_rom_,0xff,0x8000);
    __s_00 = local_160;
    pNVar9 = (pointer)auStack_1e0;
    pNVar10 = pNVar3;
    if (pNVar3 == (pointer)0x0) goto LAB_0032db40;
    do {
      pNVar13 = pNVar10;
      pNVar8 = pNVar9;
      iVar1 = *(int *)&(pNVar13->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar9 = pNVar13;
      if (iVar1 < 0x39) {
        pNVar9 = pNVar8;
      }
      pNVar10 = (&(pNVar13->children).
                  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start)[iVar1 < 0x39];
    } while (pNVar10 != (pointer)0x0);
    if (pNVar9 != (pointer)auStack_1e0) {
      if (iVar1 < 0x39) {
        pNVar13 = pNVar8;
      }
      if (*(int *)&(pNVar13->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage < 0x3a) {
        sVar14 = *(long *)&pNVar9[1].is_optional - (long)*(void **)(pNVar9 + 1);
        if (0x7fff < sVar14) {
          sVar14 = 0x8000;
        }
        memcpy(&this->epdos_rom_,*(void **)(pNVar9 + 1),sVar14);
      }
    }
    memset(&this->exdos_rom_,0xff,0x4000);
    pNVar10 = (pointer)auStack_1e0;
    do {
      pNVar9 = pNVar3;
      pNVar13 = pNVar10;
      iVar1 = *(int *)&(pNVar9->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar10 = pNVar9;
      if (iVar1 < 0x3a) {
        pNVar10 = pNVar13;
      }
      pNVar3 = (&(pNVar9->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start)[iVar1 < 0x3a];
    } while (pNVar3 != (pointer)0x0);
    if (pNVar10 != (pointer)auStack_1e0) {
      if (iVar1 < 0x3a) {
        pNVar9 = pNVar13;
      }
      if (*(int *)&(pNVar9->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage < 0x3b) {
        sVar14 = *(long *)&pNVar10[1].is_optional - (long)*(void **)(pNVar10 + 1);
        if (0x3fff < sVar14) {
          sVar14 = 0x4000;
        }
        memcpy(&this->exdos_rom_,*(void **)(pNVar10 + 1),sVar14);
      }
    }
    goto LAB_0032db56;
  }
  goto LAB_0032da02;
LAB_0032d912:
  lVar6 = lVar6 + 4;
  if (lVar6 == 0x10) goto LAB_0032da02;
  goto LAB_0032d8bd;
LAB_0032da02:
  memset(&this->epdos_rom_,0xff,0x8000);
LAB_0032db40:
  memset(&this->exdos_rom_,0xff,0x4000);
LAB_0032db56:
  pTVar4 = local_220;
  (this->key_lines_)._M_elems[8] = 0xff;
  (this->key_lines_)._M_elems[9] = 0xff;
  (this->key_lines_)._M_elems[0] = 0xff;
  (this->key_lines_)._M_elems[1] = 0xff;
  (this->key_lines_)._M_elems[2] = 0xff;
  (this->key_lines_)._M_elems[3] = 0xff;
  (this->key_lines_)._M_elems[4] = 0xff;
  (this->key_lines_)._M_elems[5] = 0xff;
  (this->key_lines_)._M_elems[6] = 0xff;
  (this->key_lines_)._M_elems[7] = 0xff;
  this->read_pointers_[0] = __s_00->_M_elems;
  this->write_pointers_[0] = (uint8_t *)0x0;
  this->write_pointers_[1] = (uint8_t *)0x0;
  this->read_pointers_[1] = (this->ram_)._M_elems + 0x3c000;
  this->read_pointers_[2] = (this->ram_)._M_elems + 0x38000;
  this->write_pointers_[2] = (uint8_t *)0x0;
  this->write_pointers_[3] = (uint8_t *)0x0;
  this->pages_[0] = '\0';
  this->pages_[1] = '\0';
  this->pages_[2] = '\0';
  this->pages_[3] = '\0';
  this->read_pointers_[3] = (this->ram_)._M_elems + 0x34000;
  this->is_video_[0] = false;
  this->is_video_[1] = false;
  this->is_video_[2] = false;
  this->is_video_[3] = false;
  if ((local_220->loading_command)._M_string_length != 0) {
    Utility::TypeRecipient<Enterprise::CharacterMapper>::add_typer
              (&this->super_TypeRecipient<Enterprise::CharacterMapper>,&local_220->loading_command);
    bVar5 = CPU::Z80::ProcessorBase::get_is_resetting(&local_158->super_ProcessorBase);
    this->should_skip_splash_screen_ = bVar5;
    this->typer_delay_ = (uint)bVar5;
  }
  bVar5 = true;
  if (((pTVar4->super_Target).media.disks.
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (pTVar4->super_Target).media.disks.
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((pTVar4->super_Target).media.tapes.
      super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pTVar4->super_Target).media.tapes.
      super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    if (((pTVar4->super_Target).media.cartridges.
         super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (pTVar4->super_Target).media.cartridges.
         super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((pTVar4->super_Target).media.mass_storage_devices.
        super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pTVar4->super_Target).media.mass_storage_devices.
        super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0032dc4f;
    if ((pTVar4->super_Target).media.cartridges.
        super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pTVar4->super_Target).media.cartridges.
        super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar5 = (pTVar4->super_Target).media.mass_storage_devices.
              super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pTVar4->super_Target).media.mass_storage_devices.
              super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  this->should_skip_splash_screen_ = bVar5;
  this->typer_delay_ = 2;
LAB_0032dc4f:
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_1e8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_238);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::Enterprise::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			min_ram_slot_(min_ram_slot(target)),
			z80_(*this),
			nick_(ram_.end() - 65536),
			dave_audio_(audio_queue_),
			speaker_(dave_audio_) {

			// Request a clock of 4Mhz; this'll be mapped upwards for Nick and downwards for Dave elsewhere.
			set_clock_rate(clock_rate);
			speaker_.set_input_rate(float(clock_rate) / float(dave_divider));

			ROM::Request request;
			using Target = Analyser::Static::Enterprise::Target;

			// Pick one or more EXOS ROMs.
			switch(target.exos_version) {
				case Target::EXOSVersion::v10:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS10);	break;
				case Target::EXOSVersion::v20:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS20);	break;
				case Target::EXOSVersion::v21:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS21);	break;
				case Target::EXOSVersion::v23:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS23);	break;
				case Target::EXOSVersion::Any:
					request =
						request && (
							ROM::Request(ROM::Name::EnterpriseEXOS10) || ROM::Request(ROM::Name::EnterpriseEXOS20) ||
							ROM::Request(ROM::Name::EnterpriseEXOS21) || ROM::Request(ROM::Name::EnterpriseEXOS23)
						);
				break;

				default: break;
			}

			// Similarly pick one or more BASIC ROMs.
			switch(target.basic_version) {
				case Target::BASICVersion::v10:
					request = request && (
						ROM::Request(ROM::Name::EnterpriseBASIC10) ||
						(ROM::Request(ROM::Name::EnterpriseBASIC10Part1) && ROM::Request(ROM::Name::EnterpriseBASIC10Part2))
					);
				break;
				case Target::BASICVersion::v11:
					request = request && (
						ROM::Request(ROM::Name::EnterpriseBASIC11) ||
						ROM::Request(ROM::Name::EnterpriseBASIC11Suffixed)
					);
				break;
				case Target::BASICVersion::v21:
					request = request && ROM::Request(ROM::Name::EnterpriseBASIC21);
				break;
				case Target::BASICVersion::Any:
					request =
						request && (
							ROM::Request(ROM::Name::EnterpriseBASIC10) ||
							(ROM::Request(ROM::Name::EnterpriseBASIC10Part1) && ROM::Request(ROM::Name::EnterpriseBASIC10Part2)) ||
							ROM::Request(ROM::Name::EnterpriseBASIC11) ||
							ROM::Request(ROM::Name::EnterpriseBASIC21)
						);
				break;

				default: break;
			}

			// Possibly add in a DOS.
			switch(target.dos) {
				case Target::DOS::EXDOS:			request = request && ROM::Request(ROM::Name::EnterpriseEXDOS);	break;
				default: break;
			}

			// Get and validate ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// Extract the appropriate EXOS ROM.
			exos_.fill(0xff);
			for(const auto rom_name: { ROM::Name::EnterpriseEXOS10, ROM::Name::EnterpriseEXOS20, ROM::Name::EnterpriseEXOS21, ROM::Name::EnterpriseEXOS23 }) {
				const auto exos = roms.find(rom_name);
				if(exos != roms.end()) {
					memcpy(exos_.data(), exos->second.data(), std::min(exos_.size(), exos->second.size()));
					break;
				}
			}

			// Extract the appropriate BASIC ROM[s] (if any).
			basic_.fill(0xff);
			bool has_basic = false;
			for(const auto rom_name: { ROM::Name::EnterpriseBASIC10, ROM::Name::EnterpriseBASIC11, ROM::Name::EnterpriseBASIC11Suffixed, ROM::Name::EnterpriseBASIC21 }) {
				const auto basic = roms.find(rom_name);
				if(basic != roms.end()) {
					memcpy(basic_.data(), basic->second.data(), std::min(basic_.size(), basic->second.size()));
					has_basic = true;
					break;
				}
			}
			if(!has_basic) {
				const auto basic1 = roms.find(ROM::Name::EnterpriseBASIC10Part1);
				const auto basic2 = roms.find(ROM::Name::EnterpriseBASIC10Part2);
				if(basic1 != roms.end() && basic2 != roms.end()) {
					memcpy(&basic_[0x0000], basic1->second.data(), std::min(size_t(8192), basic1->second.size()));
					memcpy(&basic_[0x2000], basic2->second.data(), std::min(size_t(8192), basic2->second.size()));
				}
			}

			// Extract the appropriate DOS ROMs.
			epdos_rom_.fill(0xff);
			const auto epdos = roms.find(ROM::Name::EnterpriseEPDOS);
			if(epdos != roms.end()) {
				memcpy(epdos_rom_.data(), epdos->second.data(), std::min(epdos_rom_.size(), epdos->second.size()));
			}
			exdos_rom_.fill(0xff);
			const auto exdos = roms.find(ROM::Name::EnterpriseEXDOS);
			if(exdos != roms.end()) {
				memcpy(exdos_rom_.data(), exdos->second.data(), std::min(exdos_rom_.size(), exdos->second.size()));
			}

			// Seed key state.
			clear_all_keys();

			// Take a reasonable guess at the initial memory configuration:
			// put EXOS into the first bank since this is a Z80 and therefore
			// starts from address 0; the third instruction in EXOS is a jump
			// to $c02e so it's reasonable to assume EXOS is in the highest bank
			// too, and it appears to act correctly if it's the first 16kb that's
			// in the highest bank. From there I guess: all banks are initialised
			// to 0.
			page<0>(0x00);
			page<1>(0x00);
			page<2>(0x00);
			page<3>(0x00);

			// Pass on any media.
			insert_media(target.media);
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			// Ensure the splash screen is automatically skipped if any media has been provided.
			if(!target.media.empty()) {
				should_skip_splash_screen_ = !target.media.empty();
				typer_delay_ = 2;
			}
		}